

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  undefined7 in_register_00000009;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte bVar11;
  byte *pbVar12;
  i64 iVar13;
  long lVar14;
  long lVar15;
  
  uVar7 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar7 == 1) {
    lVar14 = 1;
    bVar4 = false;
    pbVar8 = (byte *)zNum;
  }
  else {
    uVar10 = (ulong)(3 - uVar7);
    if ((int)(3 - uVar7) < length) {
      uVar10 = (ulong)(int)(3 - uVar7);
      do {
        if (zNum[uVar10] != '\0') {
          bVar4 = true;
          goto LAB_00208c33;
        }
        uVar10 = uVar10 + 2;
      } while ((long)uVar10 < (long)length);
    }
    bVar4 = false;
LAB_00208c33:
    length = (uint)uVar10 ^ 1;
    pbVar8 = (byte *)(zNum + (uVar7 & 1));
    lVar14 = 2;
  }
  pbVar12 = (byte *)(zNum + length);
  bVar2 = true;
  for (; pbVar9 = pbVar8, pbVar8 < pbVar12; pbVar8 = pbVar8 + lVar14) {
    bVar11 = *pbVar8;
    if ((""[bVar11] & 1) == 0) {
      if (bVar11 == 0x2b) {
        pbVar8 = pbVar8 + lVar14;
        pbVar9 = pbVar8;
      }
      else if (bVar11 == 0x2d) {
        pbVar8 = pbVar8 + lVar14;
        bVar2 = false;
        pbVar9 = pbVar8;
      }
      break;
    }
  }
  for (; (pbVar8 < pbVar12 && (*pbVar8 == 0x30)); pbVar8 = pbVar8 + lVar14) {
  }
  if (pbVar8 < pbVar12) {
    lVar15 = 0;
    lVar6 = 0;
    do {
      bVar11 = pbVar8[lVar15] - 0x3a;
      if (bVar11 < 0xf6) break;
      lVar6 = (ulong)pbVar8[lVar15] + lVar6 * 10 + -0x30;
      lVar15 = lVar15 + lVar14;
    } while (pbVar8 + lVar15 < pbVar12);
    uVar7 = (uint)lVar15;
    if (lVar6 < 0) {
      iVar13 = -0x8000000000000000;
      if (bVar2 != false) {
        iVar13 = 0x7fffffffffffffff;
      }
      *pNum = iVar13;
    }
    else {
      if (!bVar2) {
        lVar6 = -lVar6;
      }
      *pNum = lVar6;
    }
    if (bVar11 < 0xf6) {
      return 1;
    }
  }
  else {
    *pNum = 0;
    uVar7 = 0;
  }
  iVar5 = 1;
  if (((uVar7 != 0) || (pbVar9 != pbVar8)) && (uVar3 = (int)lVar14 * 0x13, !bVar4 && uVar7 <= uVar3)
     ) {
    if (uVar3 <= uVar7) {
      uVar10 = 0;
      pbVar12 = pbVar8;
      do {
        bVar11 = *pbVar12;
        bVar1 = "922337203685477580"[uVar10];
        if (0x10 < uVar10) break;
        uVar10 = uVar10 + 1;
        pbVar12 = pbVar12 + lVar14;
      } while (bVar11 == bVar1);
      if (bVar11 == bVar1) {
        iVar5 = (char)pbVar8[lVar14 * 0x12] + -0x38;
      }
      else {
        iVar5 = ((int)(char)bVar11 - (int)(char)bVar1) * 10;
      }
      if (-1 < iVar5) {
        if (iVar5 != 0) {
          return 1;
        }
        return (uint)bVar2 * 2;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  if( u>LARGEST_INT64 ){
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  testcase( i==18 );
  testcase( i==19 );
  testcase( i==20 );
  if( &zNum[i]<zEnd              /* Extra bytes at the end */
   || (i==0 && zStart==zNum)     /* No digits */
   || i>19*incr                  /* Too many digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    /* zNum is empty or contains non-numeric text or is longer
    ** than 19 digits (thus guaranteeing that it is too large) */
    return 1;
  }else if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return 0;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return 0;
    }else if( c>0 ){
      /* zNum is greater than 9223372036854775808 so it overflows */
      return 1;
    }else{
      /* zNum is exactly 9223372036854775808.  Fits if negative.  The
      ** special case 2 overflow if positive */
      assert( u-1==LARGEST_INT64 );
      return neg ? 0 : 2;
    }
  }
}